

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

int __thiscall position::see_move(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  U64 UVar9;
  pointer pSVar10;
  Piece PVar11;
  ulong uVar12;
  int iVar13;
  pointer pSVar14;
  ulong uVar15;
  ulong uVar16;
  Color CVar17;
  uint uVar18;
  ulong uVar19;
  int local_a8;
  SeePiece local_a4;
  Square to;
  pointer local_98;
  U64 pieces;
  ulong local_88;
  Color local_7c;
  Color local_78;
  Color local_74;
  Square wks;
  Square bks;
  vector<SeePiece,_std::allocator<SeePiece>_> white_list;
  vector<SeePiece,_std::allocator<SeePiece>_> black_list;
  
  bks = (this->ifo).ks[1];
  wks = (this->ifo).ks[0];
  to = (Square)m->t;
  bVar1 = m->f;
  uVar19 = (this->pcs).bycolor._M_elems[0];
  local_88 = (this->pcs).bycolor._M_elems[1];
  pieces = local_88 | uVar19;
  local_98 = (pointer)(uVar19 ^ (this->ifo).pinned[0]);
  local_88 = local_88 ^ (this->ifo).pinned[1];
  black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  PVar11 = no_piece;
  do {
    UVar9 = attackers_of(this,&to,&pieces);
    uVar19 = UVar9 & pieces;
    if (uVar19 == 0) {
      std::
      __sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::
      __sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      CVar17 = (this->ifo).stm;
      local_a4.p = PVar11;
      if (CVar17 == black) {
        local_a4.score = 0;
        std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                  (&black_list,
                   (const_iterator)
                   black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_a4);
      }
      else {
        local_a4.score = 0;
        std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                  (&white_list,
                   (const_iterator)
                   white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_a4);
      }
      local_98 = white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start;
      uVar19 = (long)white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar12 = (long)black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      local_88 = (ulong)to;
      uVar18 = 0;
      uVar15 = 0;
      uVar16 = 0;
      iVar13 = 0;
      goto LAB_0011dc7a;
    }
    pieces = pieces ^ uVar19;
    local_a4.p = pawn;
    local_74 = black;
    bVar7 = is_attacked(this,&wks,&local_a4.p,&local_74,pieces);
    if (bVar7) {
      local_a8 = 0;
      break;
    }
    local_78 = black;
    local_7c = white;
    bVar7 = is_attacked(this,&bks,&local_78,&local_7c,pieces);
    local_a8 = 0;
    if (bVar7) break;
    for (uVar16 = uVar19 & (ulong)local_98; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
      lVar4 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      if ((uint)lVar4 == (uint)bVar1) {
        PVar11 = (this->pcs).piece_on._M_elems[lVar4];
      }
      else {
        local_a4.p = (this->pcs).piece_on._M_elems[lVar4];
        local_a4.score =
             (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_a4.p];
        std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                  (&white_list,&local_a4);
      }
    }
    uVar19 = uVar19 & local_88;
    if (uVar19 != 0) {
      do {
        lVar4 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        if ((uint)lVar4 == (uint)bVar1) {
          PVar11 = (this->pcs).piece_on._M_elems[lVar4];
        }
        else {
          local_a4.p = (this->pcs).piece_on._M_elems[lVar4];
          local_a4.score =
               (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_a4.p];
          std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                    (&black_list,&local_a4);
        }
        uVar19 = uVar19 & uVar19 - 1;
      } while (uVar19 != 0);
    }
  } while (((white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start) ||
           (black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
            super__Vector_impl_data._M_start)) || (PVar11 != no_piece));
LAB_0011dd95:
  std::_Vector_base<SeePiece,_std::allocator<SeePiece>_>::~_Vector_base
            (&white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>);
  std::_Vector_base<SeePiece,_std::allocator<SeePiece>_>::~_Vector_base
            (&black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>);
  return local_a8;
LAB_0011dc7a:
  if (uVar18 == 0) {
    PVar11 = (this->pcs).piece_on._M_elems[local_88];
    local_a8 = 0;
    if ((ulong)PVar11 == 7) {
      uVar18 = 1;
      iVar8 = 0;
    }
    else {
      if (PVar11 == king) goto LAB_0011dd95;
      iVar8 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[PVar11];
      uVar18 = 1;
    }
  }
  else {
    local_a8 = iVar13;
    if ((uVar19 <= uVar15) || (uVar12 <= uVar16)) goto LAB_0011dd95;
    if (CVar17 == white) {
      pSVar14 = black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
      pSVar10 = white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar15;
    }
    else {
      if (CVar17 != black) goto LAB_0011dd95;
      pSVar10 = black_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar16;
      pSVar14 = white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start + uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    }
    PVar11 = pSVar10->p;
    if ((ulong)PVar11 == 7) goto LAB_0011dd95;
    PVar2 = pSVar14->p;
    iVar3 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[PVar2];
    if (iVar3 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[PVar11] || (ulong)PVar2 == 5) {
      uVar5 = uVar12;
      uVar6 = uVar19;
      if (PVar11 == king) {
        if (CVar17 == white) {
          if (uVar16 < uVar12) goto LAB_0011dd95;
          uVar5 = uVar15;
          if (PVar2 != king) goto joined_r0x0011dd75;
        }
        else {
          if (uVar15 < uVar19) goto LAB_0011dd95;
          uVar6 = uVar16;
          if (PVar2 == king) {
joined_r0x0011dd75:
            if (uVar12 <= uVar6) goto LAB_0011dd77;
            goto LAB_0011dd95;
          }
        }
      }
      else if (PVar2 == king) {
        uVar5 = uVar15;
        uVar6 = uVar16;
        if (CVar17 != white) goto joined_r0x0011dd75;
      }
      else if (CVar17 == white) goto joined_r0x0011dd75;
      if (uVar5 < uVar19) goto LAB_0011dd95;
    }
LAB_0011dd77:
    iVar8 = -iVar3;
    if ((uVar18 & 1) == 0) {
      iVar8 = iVar3;
    }
    uVar18 = uVar18 + 1;
  }
  iVar13 = iVar13 + iVar8;
  CVar17 = CVar17 ^ black;
  goto LAB_0011dc7a;
}

Assistant:

int position::see_move(const Move& m) const {

	Square bks = king_square(black);
	Square wks = king_square(white);
	Square to = Square(m.t);
	Square from = Square(m.f);
	U64 pieces = all_pieces();
	U64 attackers = 0ULL;

	U64 white_bb = get_pieces<white>() ^ pinned<white>();
	U64 black_bb = get_pieces<black>() ^ pinned<black>();

	std::vector<SeePiece> black_list;
	std::vector<SeePiece> white_list;
	Piece atkr = Piece::no_piece;

	while (true) { // while loop for pieces behind currently attacking pieces
		U64 a = attackers_of(to, pieces) & pieces;
		if (a) {
			pieces ^= a;

			if (is_attacked(wks, white, black, pieces) || is_attacked(bks, black, white, pieces))
			{
				return 0; // let search handle discovered checking sequences
			}

			attackers |= a;
		}
		else break;

		U64 white_attackers = a & white_bb;
		if (white_attackers) {
			while (white_attackers) {
				Square s = Square(bits::pop_lsb(white_attackers));
				if (s == from) {
					atkr = piece_on(Square(s));
					continue; // first attacker is handled below
				}
				white_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		U64 black_attackers = a & black_bb;
		if (black_attackers) {
			while (black_attackers) {
				Square s = Square(bits::pop_lsb(black_attackers));
				if (s == from) {
					atkr = piece_on(s);
					continue;
				}
				black_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		if (white_list.size() == 0 && black_list.size() == 0 && atkr == Piece::no_piece) return 0;
	}

	std::sort(white_list.begin(), white_list.end());
	std::sort(black_list.begin(), black_list.end());


	int i = 0;
	unsigned w = 0;
	unsigned b = 0;
	Color color = to_move();


	if (color == black) { black_list.insert(black_list.begin(), SeePiece(atkr, 0)); }
	else { white_list.insert(white_list.begin(), SeePiece(atkr, 0)); }

	int score = 0;
	int prev = score;

	while (true) {

		Piece victim = Piece::no_piece;
		if (i == 0) {
			Piece v = piece_on(to);
			if (v == Piece::king) return 0; // illegal
			score += (v == Piece::no_piece ? 0 : mvals[v]);
			color = Color(color ^ 1);
			prev = score;
			++i;
			continue;
		}

		if ((w >= white_list.size() || b >= black_list.size())) break;

		victim = (color == white ? black_list[b++].p : white_list[w++].p);

		int av = -1;
		Piece attacker = Piece::no_piece;
		if (color == white && w < white_list.size()) {
			attacker = white_list[w].p;
			av = mvals[attacker];
		}
		else if (color == black && b < black_list.size()) {
			attacker = black_list[b].p;
			av = mvals[attacker];
		}

		if (attacker == Piece::no_piece) break;


		color = Color(color ^ 1);
		int vv = mvals[victim];



		if (vv < av || victim == king) {
			if (attacker == king) {
				if ((color == black && b < black_list.size()) ||
					(color == white && w < white_list.size())) {
					return score; // illegal
				}
			}


			if ((victim == king && ((color == black && w < white_list.size()) || (color == white && b < black_list.size()))) ||
				(victim != king && ((color == black && (black_list.size() > white_list.size())) ||
					(color == white && (white_list.size() > black_list.size()))))) {
				score = prev;
				return score;
			}
		}
		score += ((i & 1) == 1 ? -vv : vv);
		++i;
		prev = score;
	}

	return score;
}